

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__check_png_header(stbi__context *s)

{
  stbi_uc sVar1;
  char *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  
  iVar2 = 0;
  while( true ) {
    if (7 < iVar2) {
      return 1;
    }
    sVar1 = stbi__get8((stbi__context *)CONCAT44(iVar2,in_stack_ffffffffffffffe8));
    if (sVar1 != stbi__check_png_header::png_sig[iVar2]) break;
    iVar2 = iVar2 + 1;
  }
  iVar2 = stbi__err(in_RDI);
  return iVar2;
}

Assistant:

static int stbi__check_png_header(stbi__context *s)
{
   static const stbi_uc png_sig[8] = { 137,80,78,71,13,10,26,10 };
   int i;
   for (i=0; i < 8; ++i)
      if (stbi__get8(s) != png_sig[i]) return stbi__err("bad png sig","Not a PNG");
   return 1;
}